

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::enter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxId *enterId,bool polish)

{
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  pointer pnVar2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *y;
  Real RVar3;
  undefined8 uVar4;
  SPxStatus stat;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar5;
  type_conflict5 tVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  pointer rhs_00;
  double *pdVar11;
  SPxOut *pSVar12;
  _func_int **pp_Var13;
  undefined7 in_register_00000011;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  cpp_dec_float<100U,_int,_void> *t;
  DataKey *pDVar14;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar15;
  uint uVar16;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  DataKey DVar17;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar18;
  char cVar19;
  ulong uVar20;
  bool bVar21;
  Status enterStat;
  uint local_a94;
  DataKey *local_a90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId none;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterTest;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterMax;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  cpp_dec_float<100U,_int,_void> local_878;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  objChange;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterLB;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterUB;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterVal;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterRO;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  multiprecision local_4e8 [8];
  uint auStack_4e0 [2];
  uint local_4d8 [2];
  uint auStack_4d0 [2];
  uint local_4c8 [2];
  uint auStack_4c0 [2];
  uint local_4b8 [2];
  undefined8 uStack_4b0;
  int local_4a8;
  undefined1 local_4a4;
  fpclass_type local_4a0;
  int32_t iStack_49c;
  uint local_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint local_488;
  uint uStack_484;
  uint uStack_480;
  uint uStack_47c;
  uint local_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint local_468;
  uint uStack_464;
  uint uStack_460;
  uint uStack_45c;
  int local_458;
  undefined1 local_454;
  fpclass_type local_450;
  int32_t iStack_44c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  uint local_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint local_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint local_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  int local_3b8;
  undefined1 local_3b4;
  fpclass_type local_3b0;
  int32_t iStack_3ac;
  cpp_dec_float<100U,_int,_void> local_3a8;
  cpp_dec_float<100U,_int,_void> local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308 [2];
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  uint local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  uint local_248;
  uint uStack_244;
  uint uStack_240;
  uint uStack_23c;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  int local_228;
  undefined1 local_224;
  fpclass_type local_220;
  int32_t iStack_21c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  multiprecision local_178 [8];
  uint auStack_170 [2];
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [2];
  uint auStack_140 [2];
  int local_138;
  undefined1 local_134;
  fpclass_type local_130;
  int32_t iStack_12c;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  int local_e8;
  undefined1 local_e4;
  fpclass_type local_e0;
  int32_t iStack_dc;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  int local_98;
  undefined1 local_94;
  fpclass_type local_90;
  int32_t iStack_8c;
  multiprecision local_80 [80];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rhs;
  
  local_a94 = (uint)CONCAT71(in_register_00000011,polish);
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  enterTest.m_backend.fpclass = cpp_dec_float_finite;
  enterTest.m_backend.prec_elem = 0x10;
  enterTest.m_backend.data._M_elems[0] = 0;
  enterTest.m_backend.data._M_elems[1] = 0;
  enterTest.m_backend.data._M_elems[2] = 0;
  enterTest.m_backend.data._M_elems[3] = 0;
  enterTest.m_backend.data._M_elems[0xc] = 0;
  enterTest.m_backend.data._M_elems[0xd] = 0;
  enterTest.m_backend.data._M_elems[0xe] = 0;
  enterTest.m_backend.data._M_elems[0xf] = 0;
  enterTest.m_backend.exp = 0;
  enterTest.m_backend.neg = false;
  enterTest.m_backend.data._M_elems[4] = 0;
  enterTest.m_backend.data._M_elems[5] = 0;
  enterTest.m_backend.data._M_elems[6] = 0;
  enterTest.m_backend.data._M_elems[7] = 0;
  enterTest.m_backend.data._M_elems[8] = 0;
  enterTest.m_backend.data._M_elems[9] = 0;
  enterTest.m_backend.data._M_elems[10] = 0;
  enterTest.m_backend.data._M_elems[0xb] = 0;
  enterUB.m_backend.fpclass = cpp_dec_float_finite;
  enterUB.m_backend.prec_elem = 0x10;
  enterUB.m_backend.data._M_elems[0] = 0;
  enterUB.m_backend.data._M_elems[1] = 0;
  enterUB.m_backend.data._M_elems[2] = 0;
  enterUB.m_backend.data._M_elems[3] = 0;
  enterUB.m_backend.data._M_elems[4] = 0;
  enterUB.m_backend.data._M_elems[5] = 0;
  enterUB.m_backend.data._M_elems[6] = 0;
  enterUB.m_backend.data._M_elems[7] = 0;
  enterUB.m_backend.data._M_elems[8] = 0;
  enterUB.m_backend.data._M_elems[9] = 0;
  enterUB.m_backend.data._M_elems[10] = 0;
  enterUB.m_backend.data._M_elems[0xb] = 0;
  enterUB.m_backend.data._M_elems[0xc] = 0;
  enterUB.m_backend.data._M_elems[0xd] = 0;
  enterUB.m_backend.data._M_elems._56_5_ = 0;
  enterUB.m_backend.data._M_elems[0xf]._1_3_ = 0;
  enterUB.m_backend.exp = 0;
  enterUB.m_backend.neg = false;
  enterLB.m_backend.fpclass = cpp_dec_float_finite;
  enterLB.m_backend.prec_elem = 0x10;
  enterLB.m_backend.data._M_elems[0] = 0;
  enterLB.m_backend.data._M_elems[1] = 0;
  enterLB.m_backend.data._M_elems[2] = 0;
  enterLB.m_backend.data._M_elems[3] = 0;
  enterLB.m_backend.data._M_elems[4] = 0;
  enterLB.m_backend.data._M_elems[5] = 0;
  enterLB.m_backend.data._M_elems[6] = 0;
  enterLB.m_backend.data._M_elems[7] = 0;
  enterLB.m_backend.data._M_elems[8] = 0;
  enterLB.m_backend.data._M_elems[9] = 0;
  enterLB.m_backend.data._M_elems[10] = 0;
  enterLB.m_backend.data._M_elems[0xb] = 0;
  enterLB.m_backend.data._M_elems[0xc] = 0;
  enterLB.m_backend.data._M_elems[0xd] = 0;
  enterLB.m_backend.data._M_elems._56_5_ = 0;
  enterLB.m_backend.data._M_elems[0xf]._1_3_ = 0;
  enterLB.m_backend.exp = 0;
  enterLB.m_backend.neg = false;
  enterVal.m_backend.fpclass = cpp_dec_float_finite;
  enterVal.m_backend.prec_elem = 0x10;
  enterVal.m_backend.data._M_elems[0] = 0;
  enterVal.m_backend.data._M_elems[1] = 0;
  enterVal.m_backend.data._M_elems[2] = 0;
  enterVal.m_backend.data._M_elems[3] = 0;
  enterVal.m_backend.data._M_elems[4] = 0;
  enterVal.m_backend.data._M_elems[5] = 0;
  enterVal.m_backend.data._M_elems[6] = 0;
  enterVal.m_backend.data._M_elems[7] = 0;
  enterVal.m_backend.data._M_elems[0xc] = 0;
  enterVal.m_backend.data._M_elems[0xd] = 0;
  enterVal.m_backend.data._M_elems._56_5_ = 0;
  enterVal.m_backend.data._M_elems[0xf]._1_3_ = 0;
  enterVal.m_backend.exp = 0;
  enterVal.m_backend.neg = false;
  enterVal.m_backend.data._M_elems[8] = 0;
  enterVal.m_backend.data._M_elems[9] = 0;
  enterVal.m_backend.data._M_elems[10] = 0;
  enterVal.m_backend.data._M_elems[0xb] = 0;
  enterMax.m_backend.fpclass = cpp_dec_float_finite;
  enterMax.m_backend.prec_elem = 0x10;
  enterMax.m_backend.data._M_elems[0] = 0;
  enterMax.m_backend.data._M_elems[1] = 0;
  enterMax.m_backend.data._M_elems[2] = 0;
  enterMax.m_backend.data._M_elems[3] = 0;
  enterMax.m_backend.data._M_elems[0xc] = 0;
  enterMax.m_backend.data._M_elems[0xd] = 0;
  enterMax.m_backend.data._M_elems[0xe] = 0;
  enterMax.m_backend.data._M_elems[0xf] = 0;
  enterMax.m_backend.exp = 0;
  enterMax.m_backend.neg = false;
  enterMax.m_backend.data._M_elems[4] = 0;
  enterMax.m_backend.data._M_elems[5] = 0;
  enterMax.m_backend.data._M_elems[6] = 0;
  enterMax.m_backend.data._M_elems[7] = 0;
  enterMax.m_backend.data._M_elems[8] = 0;
  enterMax.m_backend.data._M_elems[9] = 0;
  enterMax.m_backend.data._M_elems[10] = 0;
  enterMax.m_backend.data._M_elems[0xb] = 0;
  local_878.fpclass = cpp_dec_float_finite;
  local_878.prec_elem = 0x10;
  local_878.data._M_elems[0] = 0;
  local_878.data._M_elems[1] = 0;
  local_878.data._M_elems[2] = 0;
  local_878.data._M_elems[3] = 0;
  local_878.data._M_elems[4] = 0;
  local_878.data._M_elems[5] = 0;
  local_878.data._M_elems[6] = 0;
  local_878.data._M_elems[7] = 0;
  local_878.data._M_elems[8] = 0;
  local_878.data._M_elems[9] = 0;
  local_878.data._M_elems[10] = 0;
  local_878.data._M_elems[0xb] = 0;
  local_878.data._M_elems[0xc] = 0;
  local_878.data._M_elems[0xd] = 0;
  local_878.data._M_elems._56_5_ = 0;
  local_878.data._M_elems[0xf]._1_3_ = 0;
  local_878.exp = 0;
  local_878.neg = false;
  enterRO.m_backend.fpclass = cpp_dec_float_finite;
  enterRO.m_backend.prec_elem = 0x10;
  enterRO.m_backend.data._M_elems[0] = 0;
  enterRO.m_backend.data._M_elems[1] = 0;
  enterRO.m_backend.data._M_elems[2] = 0;
  enterRO.m_backend.data._M_elems[3] = 0;
  enterRO.m_backend.data._M_elems[4] = 0;
  enterRO.m_backend.data._M_elems[5] = 0;
  enterRO.m_backend.data._M_elems[6] = 0;
  enterRO.m_backend.data._M_elems[7] = 0;
  enterRO.m_backend.data._M_elems[8] = 0;
  enterRO.m_backend.data._M_elems[9] = 0;
  enterRO.m_backend.data._M_elems[10] = 0;
  enterRO.m_backend.data._M_elems[0xb] = 0;
  enterRO.m_backend.data._M_elems[0xc] = 0;
  enterRO.m_backend.data._M_elems[0xd] = 0;
  enterRO.m_backend.data._M_elems._56_5_ = 0;
  enterRO.m_backend.data._M_elems[0xf]._1_3_ = 0;
  enterRO.m_backend.exp = 0;
  enterRO.m_backend.neg = false;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum(&objChange);
  iVar9 = (*(this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x7e])(this,enterId);
  uVar10 = local_a94;
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(extraout_var,iVar9);
  bVar7 = this->instableEnter;
  local_a90 = &enterId->super_DataKey;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,&local_878
             ,&enterStat,&enterRO,&objChange);
  if (uVar10 == 0) {
    epsilon(&leavebound,this);
    result.m_backend.data._M_elems[0xf]._1_3_ = leavebound.m_backend.data._M_elems[0xf]._1_3_;
    result.m_backend.data._M_elems._56_5_ = leavebound.m_backend.data._M_elems._56_5_;
    result.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = leavebound.m_backend.data._M_elems[1];
    uVar4 = result.m_backend.data._M_elems._0_8_;
    result.m_backend.data._M_elems[2] = leavebound.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = leavebound.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems[0xc] = leavebound.m_backend.data._M_elems[0xc];
    result.m_backend.data._M_elems[0xd] = leavebound.m_backend.data._M_elems[0xd];
    result.m_backend.data._M_elems[8] = leavebound.m_backend.data._M_elems[8];
    result.m_backend.data._M_elems[9] = leavebound.m_backend.data._M_elems[9];
    result.m_backend.data._M_elems[10] = leavebound.m_backend.data._M_elems[10];
    result.m_backend.data._M_elems[0xb] = leavebound.m_backend.data._M_elems[0xb];
    result.m_backend.data._M_elems[4] = leavebound.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = leavebound.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems[6] = leavebound.m_backend.data._M_elems[6];
    result.m_backend.data._M_elems[7] = leavebound.m_backend.data._M_elems[7];
    result.m_backend.exp = leavebound.m_backend.exp;
    result.m_backend.neg = leavebound.m_backend.neg;
    result.m_backend.fpclass = leavebound.m_backend.fpclass;
    result.m_backend.prec_elem = leavebound.m_backend.prec_elem;
    result.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
    if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
        result.m_backend.data._M_elems[0] != 0) {
      result.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
    }
    result.m_backend.data._M_elems._0_8_ = uVar4;
    tVar6 = boost::multiprecision::operator>(&enterTest,&result);
    if (!tVar6) goto LAB_002f85a2;
    local_a8 = enterTest.m_backend.data._M_elems[0xc];
    uStack_a4 = enterTest.m_backend.data._M_elems[0xd];
    uStack_a0 = enterTest.m_backend.data._M_elems[0xe];
    uStack_9c = enterTest.m_backend.data._M_elems[0xf];
    local_b8 = enterTest.m_backend.data._M_elems[8];
    uStack_b4 = enterTest.m_backend.data._M_elems[9];
    uStack_b0 = enterTest.m_backend.data._M_elems[10];
    uStack_ac = enterTest.m_backend.data._M_elems[0xb];
    local_c8 = enterTest.m_backend.data._M_elems[4];
    uStack_c4 = enterTest.m_backend.data._M_elems[5];
    uStack_c0 = enterTest.m_backend.data._M_elems[6];
    uStack_bc = enterTest.m_backend.data._M_elems[7];
    local_d8 = enterTest.m_backend.data._M_elems[0];
    uStack_d4 = enterTest.m_backend.data._M_elems[1];
    uStack_d0 = enterTest.m_backend.data._M_elems[2];
    uStack_cc = enterTest.m_backend.data._M_elems[3];
    local_98 = enterTest.m_backend.exp;
    local_94 = enterTest.m_backend.neg;
    local_90 = enterTest.m_backend.fpclass;
    iStack_8c = enterTest.m_backend.prec_elem;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x84])(this,*local_a90,&local_d8,(ulong)(uint)enterStat);
    pp_Var13 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
    bVar21 = false;
  }
  else {
LAB_002f85a2:
    pDVar14 = local_a90;
    pUVar15 = this->theFvec;
    if (((pUVar15->thedelta).setupStatus == true) && ((pUVar15->thedelta).super_IdxSet.num == 0)) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solve4update(&this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,&pUVar15->thedelta,rhs);
    }
    cVar19 = (char)uVar10;
    if ((cVar19 == '\0') && (this->m_maxCycle < this->m_numCycle)) {
      result.m_backend.data._M_elems[0xf] = enterMax.m_backend.data._M_elems[0xf];
      result.m_backend.data._M_elems[0xe] = enterMax.m_backend.data._M_elems[0xe];
      result.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
      uVar4 = result.m_backend.data._M_elems._0_8_;
      result.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
      result.m_backend.data._M_elems[0xc] = enterMax.m_backend.data._M_elems[0xc];
      result.m_backend.data._M_elems[0xd] = enterMax.m_backend.data._M_elems[0xd];
      result.m_backend.data._M_elems[8] = enterMax.m_backend.data._M_elems[8];
      result.m_backend.data._M_elems[9] = enterMax.m_backend.data._M_elems[9];
      result.m_backend.data._M_elems[10] = enterMax.m_backend.data._M_elems[10];
      result.m_backend.data._M_elems[0xb] = enterMax.m_backend.data._M_elems[0xb];
      result.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
      result.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
      result.m_backend.exp = enterMax.m_backend.exp;
      result.m_backend.neg = enterMax.m_backend.neg;
      result.m_backend.fpclass = enterMax.m_backend.fpclass;
      result.m_backend.prec_elem = enterMax.m_backend.prec_elem;
      result.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
      if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
          result.m_backend.data._M_elems[0] != 0) {
        result.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
      }
      leavebound.m_backend.data._M_elems._0_8_ =
           leavebound.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      result.m_backend.data._M_elems._0_8_ = uVar4;
      tVar6 = boost::multiprecision::operator>(&result,(int *)&leavebound);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[(ulong)tVar6 + 0x89])(this);
    }
    result.m_backend.data._M_elems[0xf] = enterMax.m_backend.data._M_elems[0xf];
    result.m_backend.data._M_elems[0xe] = enterMax.m_backend.data._M_elems[0xe];
    result.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
    uVar4 = result.m_backend.data._M_elems._0_8_;
    result.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems[0xc] = enterMax.m_backend.data._M_elems[0xc];
    result.m_backend.data._M_elems[0xd] = enterMax.m_backend.data._M_elems[0xd];
    result.m_backend.data._M_elems[8] = enterMax.m_backend.data._M_elems[8];
    result.m_backend.data._M_elems[9] = enterMax.m_backend.data._M_elems[9];
    result.m_backend.data._M_elems[10] = enterMax.m_backend.data._M_elems[10];
    result.m_backend.data._M_elems[0xb] = enterMax.m_backend.data._M_elems[0xb];
    result.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
    result.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
    result.m_backend.exp = enterMax.m_backend.exp;
    result.m_backend.neg = enterMax.m_backend.neg;
    result.m_backend.fpclass = enterMax.m_backend.fpclass;
    result.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    result.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0
       ) {
      result.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    this->boundflips = 0;
    local_f8 = enterTest.m_backend.data._M_elems[0xc];
    uStack_f4 = enterTest.m_backend.data._M_elems[0xd];
    uStack_f0 = enterTest.m_backend.data._M_elems[0xe];
    uStack_ec = enterTest.m_backend.data._M_elems[0xf];
    local_108 = enterTest.m_backend.data._M_elems[8];
    uStack_104 = enterTest.m_backend.data._M_elems[9];
    uStack_100 = enterTest.m_backend.data._M_elems[10];
    uStack_fc = enterTest.m_backend.data._M_elems[0xb];
    local_118 = enterTest.m_backend.data._M_elems[4];
    uStack_114 = enterTest.m_backend.data._M_elems[5];
    uStack_110 = enterTest.m_backend.data._M_elems[6];
    uStack_10c = enterTest.m_backend.data._M_elems[7];
    local_128 = enterTest.m_backend.data._M_elems[0];
    uStack_124 = enterTest.m_backend.data._M_elems[1];
    uStack_120 = enterTest.m_backend.data._M_elems[2];
    uStack_11c = enterTest.m_backend.data._M_elems[3];
    local_e8 = enterTest.m_backend.exp;
    local_e4 = enterTest.m_backend.neg;
    local_e0 = enterTest.m_backend.fpclass;
    iStack_dc = enterTest.m_backend.prec_elem;
    result.m_backend.data._M_elems._0_8_ = uVar4;
    uVar10 = (*this->theratiotester->_vptr_SPxRatioTester[7])();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&(this->instableEnterVal).m_backend,0);
    (this->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
    this->instableEnter = false;
    bVar21 = -1 < (int)uVar10;
    if (bVar21) {
      local_178 = (multiprecision  [8])result.m_backend.data._M_elems._0_8_;
      auStack_170[0] = result.m_backend.data._M_elems[2];
      auStack_170[1] = result.m_backend.data._M_elems[3];
      local_168[0] = result.m_backend.data._M_elems[4];
      local_168[1] = result.m_backend.data._M_elems[5];
      auStack_160[0] = result.m_backend.data._M_elems[6];
      auStack_160[1] = result.m_backend.data._M_elems[7];
      local_158[0] = result.m_backend.data._M_elems[8];
      local_158[1] = result.m_backend.data._M_elems[9];
      auStack_150[0] = result.m_backend.data._M_elems[10];
      auStack_150[1] = result.m_backend.data._M_elems[0xb];
      local_148[0] = result.m_backend.data._M_elems[0xc];
      local_148[1] = result.m_backend.data._M_elems[0xd];
      auStack_140[0] = result.m_backend.data._M_elems[0xe];
      auStack_140[1] = result.m_backend.data._M_elems[0xf];
      local_138 = result.m_backend.exp;
      local_134 = result.m_backend.neg;
      local_130 = result.m_backend.fpclass;
      iStack_12c = result.m_backend.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&leavebound,local_178,arg);
      entertol(&result_4,this);
      tVar6 = boost::multiprecision::operator<(&leavebound,&result_4);
      if (tVar6) {
        pnVar2 = (this->theUBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[uVar10].m_backend.data;
        local_1c8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2);
        puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
        local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 8;
        local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_1c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 0xc;
        local_1c8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_1c8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_1c8.m_backend.exp = pnVar2[uVar10].m_backend.exp;
        local_1c8.m_backend.neg = pnVar2[uVar10].m_backend.neg;
        local_1c8.m_backend.fpclass = pnVar2[uVar10].m_backend.fpclass;
        local_1c8.m_backend.prec_elem = pnVar2[uVar10].m_backend.prec_elem;
        pnVar2 = (this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[uVar10].m_backend.data;
        local_218.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2);
        puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
        local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 8;
        local_218.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_218.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 0xc;
        local_218.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_218.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_218.m_backend.exp = pnVar2[uVar10].m_backend.exp;
        local_218.m_backend.neg = pnVar2[uVar10].m_backend.neg;
        local_218.m_backend.fpclass = pnVar2[uVar10].m_backend.fpclass;
        local_218.m_backend.prec_elem = pnVar2[uVar10].m_backend.prec_elem;
        RVar3 = Tolerances::epsilon((this->
                                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    )._tolerances.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
        bVar7 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_1c8,&local_218,RVar3);
        if (((bVar7) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
          this->m_numCycle = this->m_numCycle + 1;
          this->enterCycles = this->enterCycles + 1;
        }
      }
      else {
        this->m_numCycle = this->m_numCycle / 2;
      }
      pSVar18 = this->coSolveVector2;
      y = this->coSolveVector3;
      this_00 = &this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      x = &this->theCoPvec->thedelta;
      rhs_00 = (this->unitVecs).data.
               super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10;
      if (y == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0) {
        if (pSVar18 ==
            (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
        }
        else {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,pSVar18,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,this->coSolveVector2rhs);
        }
      }
      else {
        if (pSVar18 ==
            (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,y,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,this->coSolveVector3rhs);
        }
        else {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,pSVar18,y,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,this->coSolveVector2rhs,this->coSolveVector3rhs);
        }
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator-=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)this->theCoPvec,this->coSolveVector3);
      }
      local_a94 = uVar10;
      if (0 < this->boundflips) {
        uVar20 = ((long)(this->coSolveVector3->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->coSolveVector3->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x50 & 0xffffffff;
        while (0 < (int)uVar20) {
          uVar20 = uVar20 - 1;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_80,this->coSolveVector3,(int)uVar20);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&leavebound,local_80,arg_01);
          epsilon(&result_4,this);
          tVar6 = boost::multiprecision::operator>(&leavebound,&result_4);
          if (tVar6) {
            pUVar15 = this->thePvec;
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[](&result_4,this->coSolveVector3,(int)uVar20);
            leavebound.m_backend.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
            leavebound.m_backend.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
            uVar4 = leavebound.m_backend.data._M_elems._0_8_;
            leavebound.m_backend.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
            leavebound.m_backend.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
            leavebound.m_backend.data._M_elems[0xc] = result_4.m_backend.data._M_elems[0xc];
            leavebound.m_backend.data._M_elems[0xd] = result_4.m_backend.data._M_elems[0xd];
            leavebound.m_backend.data._M_elems[8] = result_4.m_backend.data._M_elems[8];
            leavebound.m_backend.data._M_elems[9] = result_4.m_backend.data._M_elems[9];
            leavebound.m_backend.data._M_elems[10] = result_4.m_backend.data._M_elems[10];
            leavebound.m_backend.data._M_elems[0xb] = result_4.m_backend.data._M_elems[0xb];
            leavebound.m_backend.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
            leavebound.m_backend.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
            leavebound.m_backend.data._M_elems[6] = result_4.m_backend.data._M_elems[6];
            leavebound.m_backend.data._M_elems[7] = result_4.m_backend.data._M_elems[7];
            leavebound.m_backend.exp = result_4.m_backend.exp;
            leavebound.m_backend.neg = result_4.m_backend.neg;
            leavebound.m_backend.fpclass = result_4.m_backend.fpclass;
            leavebound.m_backend.prec_elem = result_4.m_backend.prec_elem;
            leavebound.m_backend.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
            if (result_4.m_backend.fpclass != cpp_dec_float_finite ||
                leavebound.m_backend.data._M_elems[0] != 0) {
              leavebound.m_backend.neg = (bool)(result_4.m_backend.neg ^ 1);
            }
            leavebound.m_backend.data._M_elems._0_8_ = uVar4;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)pUVar15,&leavebound,
                       (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)((this->thecovectors->set).theitem +
                          (this->thecovectors->set).thekey[uVar20 & 0xffffffff].idx));
          }
        }
        if (local_a90->info < 1) {
          pUVar15 = this->thePvec;
          SPxRowId::SPxRowId((SPxRowId *)&leavebound,(SPxId *)local_a90);
          pLVar5 = &(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        else {
          pUVar15 = this->theCoPvec;
          SPxColId::SPxColId((SPxColId *)&leavebound,(SPxId *)local_a90);
          pLVar5 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                ::number(&(pLVar5->
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).set,(DataKey *)&leavebound);
        pnVar2 = (pUVar15->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_878.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[iVar9].m_backend;
        local_878.data._M_elems._8_8_ = *(undefined8 *)(pnVar2[iVar9].m_backend.data._M_elems + 2);
        puVar1 = pnVar2[iVar9].m_backend.data._M_elems + 4;
        local_878.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_878.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = pnVar2[iVar9].m_backend.data._M_elems + 8;
        local_878.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_878.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = pnVar2[iVar9].m_backend.data._M_elems + 0xc;
        local_878.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_878.data._M_elems._56_5_ = SUB85(uVar4,0);
        local_878.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_878.exp = pnVar2[iVar9].m_backend.exp;
        local_878.neg = pnVar2[iVar9].m_backend.neg;
        local_878.fpclass = pnVar2[iVar9].m_backend.fpclass;
        local_878.prec_elem = pnVar2[iVar9].m_backend.prec_elem;
        this->totalboundflips = this->totalboundflips + this->boundflips;
      }
      pnVar2 = (this->theCoPrhs->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = enterRO.m_backend.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(enterRO.m_backend.data._M_elems[0xf]._1_3_,
                    enterRO.m_backend.data._M_elems._56_5_);
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar1 = enterRO.m_backend.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = enterRO.m_backend.data._M_elems._40_8_;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = enterRO.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = enterRO.m_backend.data._M_elems._24_8_;
      *(undefined8 *)&pnVar2[uVar10].m_backend.data = enterRO.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2) =
           enterRO.m_backend.data._M_elems._8_8_;
      pnVar2[uVar10].m_backend.exp = enterRO.m_backend.exp;
      pnVar2[uVar10].m_backend.neg = enterRO.m_backend.neg;
      pnVar2[uVar10].m_backend.fpclass = enterRO.m_backend.fpclass;
      pnVar2[uVar10].m_backend.prec_elem = enterRO.m_backend.prec_elem;
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x10;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems[8] = 0;
      result_4.m_backend.data._M_elems[9] = 0;
      result_4.m_backend.data._M_elems[10] = 0;
      result_4.m_backend.data._M_elems[0xb] = 0;
      result_4.m_backend.data._M_elems[0xc] = 0;
      result_4.m_backend.data._M_elems[0xd] = 0;
      result_4.m_backend.data._M_elems._56_5_ = 0;
      result_4.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_4.m_backend,&enterRO.m_backend,&local_878);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_7.m_backend,&this->theFvec->thedelta,local_a94);
      leavebound.m_backend.fpclass = cpp_dec_float_finite;
      leavebound.m_backend.prec_elem = 0x10;
      leavebound.m_backend.data._M_elems[0] = 0;
      leavebound.m_backend.data._M_elems[1] = 0;
      leavebound.m_backend.data._M_elems[2] = 0;
      leavebound.m_backend.data._M_elems[3] = 0;
      leavebound.m_backend.data._M_elems[4] = 0;
      leavebound.m_backend.data._M_elems[5] = 0;
      leavebound.m_backend.data._M_elems[6] = 0;
      leavebound.m_backend.data._M_elems[7] = 0;
      leavebound.m_backend.data._M_elems[8] = 0;
      leavebound.m_backend.data._M_elems[9] = 0;
      leavebound.m_backend.data._M_elems[10] = 0;
      leavebound.m_backend.data._M_elems[0xb] = 0;
      leavebound.m_backend.data._M_elems[0xc] = 0;
      leavebound.m_backend.data._M_elems[0xd] = 0;
      leavebound.m_backend.data._M_elems._56_5_ = 0;
      leavebound.m_backend.data._M_elems[0xf]._1_3_ = 0;
      leavebound.m_backend.exp = 0;
      leavebound.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&leavebound.m_backend,&result_4.m_backend,&result_7.m_backend);
      pUVar15 = this->theCoPvec;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 0xc) =
           leavebound.m_backend.data._M_elems._48_8_;
      *(ulong *)((pUVar15->theval).m_backend.data._M_elems + 0xe) =
           CONCAT35(leavebound.m_backend.data._M_elems[0xf]._1_3_,
                    leavebound.m_backend.data._M_elems._56_5_);
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 8) =
           leavebound.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 10) =
           leavebound.m_backend.data._M_elems._40_8_;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 4) =
           leavebound.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 6) =
           leavebound.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(pUVar15->theval).m_backend.data._M_elems =
           leavebound.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 2) =
           leavebound.m_backend.data._M_elems._8_8_;
      (pUVar15->theval).m_backend.exp = leavebound.m_backend.exp;
      (pUVar15->theval).m_backend.neg = leavebound.m_backend.neg;
      (pUVar15->theval).m_backend.fpclass = leavebound.m_backend.fpclass;
      (pUVar15->theval).m_backend.prec_elem = leavebound.m_backend.prec_elem;
      pUVar15 = this->theCoPvec;
      epsilon(&leavebound,this);
      tVar6 = boost::multiprecision::operator>(&pUVar15->theval,&leavebound);
      if (tVar6) {
LAB_002f91ec:
        pDVar14 = local_a90;
        uVar16 = local_a94;
        if (this->thePricing == FULL) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&(this->thePvec->theval).m_backend,&(this->theCoPvec->theval).m_backend);
          (*(this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x86])(this);
        }
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x87])(this);
      }
      else {
        pUVar15 = this->theCoPvec;
        epsilon(&result_7,this);
        result_4.m_backend.data._M_elems[0] = result_7.m_backend.data._M_elems[0];
        result_4.m_backend.data._M_elems[1] = result_7.m_backend.data._M_elems[1];
        uVar4 = result_4.m_backend.data._M_elems._0_8_;
        result_4.m_backend.data._M_elems[2] = result_7.m_backend.data._M_elems[2];
        result_4.m_backend.data._M_elems[3] = result_7.m_backend.data._M_elems[3];
        result_4.m_backend.data._M_elems[0xc] = result_7.m_backend.data._M_elems[0xc];
        result_4.m_backend.data._M_elems[0xd] = result_7.m_backend.data._M_elems[0xd];
        result_4.m_backend.data._M_elems._56_5_ = result_7.m_backend.data._M_elems._56_5_;
        result_4.m_backend.data._M_elems[0xf]._1_3_ = result_7.m_backend.data._M_elems[0xf]._1_3_;
        result_4.m_backend.data._M_elems[8] = result_7.m_backend.data._M_elems[8];
        result_4.m_backend.data._M_elems[9] = result_7.m_backend.data._M_elems[9];
        result_4.m_backend.data._M_elems[10] = result_7.m_backend.data._M_elems[10];
        result_4.m_backend.data._M_elems[0xb] = result_7.m_backend.data._M_elems[0xb];
        result_4.m_backend.data._M_elems[4] = result_7.m_backend.data._M_elems[4];
        result_4.m_backend.data._M_elems[5] = result_7.m_backend.data._M_elems[5];
        result_4.m_backend.data._M_elems[6] = result_7.m_backend.data._M_elems[6];
        result_4.m_backend.data._M_elems[7] = result_7.m_backend.data._M_elems[7];
        result_4.m_backend.exp = result_7.m_backend.exp;
        result_4.m_backend.neg = result_7.m_backend.neg;
        result_4.m_backend.fpclass = result_7.m_backend.fpclass;
        result_4.m_backend.prec_elem = result_7.m_backend.prec_elem;
        result_4.m_backend.data._M_elems[0] = result_7.m_backend.data._M_elems[0];
        if (result_7.m_backend.fpclass != cpp_dec_float_finite ||
            result_4.m_backend.data._M_elems[0] != 0) {
          result_4.m_backend.neg = (bool)(result_7.m_backend.neg ^ 1);
        }
        result_4.m_backend.data._M_elems._0_8_ = uVar4;
        tVar6 = boost::multiprecision::operator<(&pUVar15->theval,&result_4);
        pDVar14 = local_a90;
        uVar16 = local_a94;
        if (tVar6) goto LAB_002f91ec;
      }
      leavebound.m_backend.fpclass = cpp_dec_float_finite;
      leavebound.m_backend.prec_elem = 0x10;
      leavebound.m_backend.data._M_elems[0] = 0;
      leavebound.m_backend.data._M_elems[1] = 0;
      leavebound.m_backend.data._M_elems[2] = 0;
      leavebound.m_backend.data._M_elems[3] = 0;
      leavebound.m_backend.data._M_elems[4] = 0;
      leavebound.m_backend.data._M_elems[5] = 0;
      leavebound.m_backend.data._M_elems[6] = 0;
      leavebound.m_backend.data._M_elems[7] = 0;
      leavebound.m_backend.data._M_elems[8] = 0;
      leavebound.m_backend.data._M_elems[9] = 0;
      leavebound.m_backend.data._M_elems[10] = 0;
      leavebound.m_backend.data._M_elems[0xb] = 0;
      leavebound.m_backend.data._M_elems[0xc] = 0;
      leavebound.m_backend.data._M_elems[0xd] = 0;
      leavebound.m_backend.data._M_elems._56_5_ = 0;
      leavebound.m_backend.data._M_elems[0xf]._1_3_ = 0;
      leavebound.m_backend.exp = 0;
      leavebound.m_backend.neg = false;
      local_268 = enterMax.m_backend.data._M_elems[0];
      uStack_264 = enterMax.m_backend.data._M_elems[1];
      uStack_260 = enterMax.m_backend.data._M_elems[2];
      uStack_25c = enterMax.m_backend.data._M_elems[3];
      local_258 = enterMax.m_backend.data._M_elems[4];
      uStack_254 = enterMax.m_backend.data._M_elems[5];
      uStack_250 = enterMax.m_backend.data._M_elems[6];
      uStack_24c = enterMax.m_backend.data._M_elems[7];
      local_248 = enterMax.m_backend.data._M_elems[8];
      uStack_244 = enterMax.m_backend.data._M_elems[9];
      uStack_240 = enterMax.m_backend.data._M_elems[10];
      uStack_23c = enterMax.m_backend.data._M_elems[0xb];
      local_238 = enterMax.m_backend.data._M_elems[0xc];
      uStack_234 = enterMax.m_backend.data._M_elems[0xd];
      uStack_230 = enterMax.m_backend.data._M_elems[0xe];
      uStack_22c = enterMax.m_backend.data._M_elems[0xf];
      local_228 = enterMax.m_backend.exp;
      local_224 = enterMax.m_backend.neg;
      local_220 = enterMax.m_backend.fpclass;
      iStack_21c = enterMax.m_backend.prec_elem;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x82])(this,(ulong)uVar16,&local_268,&leavebound,&objChange);
      pnVar2 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = enterUB.m_backend.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(enterUB.m_backend.data._M_elems[0xf]._1_3_,
                    enterUB.m_backend.data._M_elems._56_5_);
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar1 = enterUB.m_backend.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = enterUB.m_backend.data._M_elems._40_8_;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = enterUB.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = enterUB.m_backend.data._M_elems._24_8_;
      *(undefined8 *)&pnVar2[uVar10].m_backend.data = enterUB.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2) =
           enterUB.m_backend.data._M_elems._8_8_;
      pnVar2[uVar10].m_backend.exp = enterUB.m_backend.exp;
      pnVar2[uVar10].m_backend.neg = enterUB.m_backend.neg;
      pnVar2[uVar10].m_backend.fpclass = enterUB.m_backend.fpclass;
      pnVar2[uVar10].m_backend.prec_elem = enterUB.m_backend.prec_elem;
      pnVar2 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = enterLB.m_backend.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(enterLB.m_backend.data._M_elems[0xf]._1_3_,
                    enterLB.m_backend.data._M_elems._56_5_);
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar1 = enterLB.m_backend.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = enterLB.m_backend.data._M_elems._40_8_;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = enterLB.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = enterLB.m_backend.data._M_elems._24_8_;
      *(undefined8 *)&pnVar2[uVar10].m_backend.data = enterLB.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2) =
           enterLB.m_backend.data._M_elems._8_8_;
      pnVar2[uVar10].m_backend.exp = enterLB.m_backend.exp;
      pnVar2[uVar10].m_backend.neg = enterLB.m_backend.neg;
      pnVar2[uVar10].m_backend.fpclass = enterLB.m_backend.fpclass;
      pnVar2[uVar10].m_backend.prec_elem = enterLB.m_backend.prec_elem;
      updateCoTest(this);
      if (this->thePricing == FULL) {
        updateTest(this);
      }
      pUVar15 = this->theFvec;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 0xc) =
           result.m_backend.data._M_elems._48_8_;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 0xe) =
           result.m_backend.data._M_elems._56_8_;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 8) =
           result.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 10) =
           result.m_backend.data._M_elems._40_8_;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 6) =
           result.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(pUVar15->theval).m_backend.data._M_elems =
           result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (pUVar15->theval).m_backend.exp = result.m_backend.exp;
      (pUVar15->theval).m_backend.neg = result.m_backend.neg;
      (pUVar15->theval).m_backend.fpclass = result.m_backend.fpclass;
      (pUVar15->theval).m_backend.prec_elem = result.m_backend.prec_elem;
      UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::update(this->theFvec);
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 0x10;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems[6] = 0;
      result_4.m_backend.data._M_elems[7] = 0;
      result_4.m_backend.data._M_elems[8] = 0;
      result_4.m_backend.data._M_elems[9] = 0;
      result_4.m_backend.data._M_elems[10] = 0;
      result_4.m_backend.data._M_elems[0xb] = 0;
      result_4.m_backend.data._M_elems[0xc] = 0;
      result_4.m_backend.data._M_elems[0xd] = 0;
      result_4.m_backend.data._M_elems._56_5_ = 0;
      result_4.m_backend.data._M_elems[0xf]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result_4.m_backend,&enterVal.m_backend,&result.m_backend);
      pnVar2 = (this->theFvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = result_4.m_backend.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(result_4.m_backend.data._M_elems[0xf]._1_3_,
                    result_4.m_backend.data._M_elems._56_5_);
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar1 = result_4.m_backend.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = result_4.m_backend.data._M_elems._40_8_;
      puVar1 = pnVar2[uVar10].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = result_4.m_backend.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = result_4.m_backend.data._M_elems._24_8_;
      *(undefined8 *)&pnVar2[uVar10].m_backend = result_4.m_backend.data._M_elems._0_8_;
      *(undefined8 *)(pnVar2[uVar10].m_backend.data._M_elems + 2) =
           result_4.m_backend.data._M_elems._8_8_;
      pnVar2[uVar10].m_backend.exp = result_4.m_backend.exp;
      pnVar2[uVar10].m_backend.neg = result_4.m_backend.neg;
      pnVar2[uVar10].m_backend.fpclass = result_4.m_backend.fpclass;
      pnVar2[uVar10].m_backend.prec_elem = result_4.m_backend.prec_elem;
      epsilon(&result_4,this);
      tVar6 = boost::multiprecision::operator>(&leavebound,&result_4);
      if (tVar6) {
LAB_002f9562:
        result_4.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
        result_4.m_backend.data._M_elems[1] = leavebound.m_backend.data._M_elems[1];
        uVar4 = result_4.m_backend.data._M_elems._0_8_;
        result_4.m_backend.data._M_elems[2] = leavebound.m_backend.data._M_elems[2];
        result_4.m_backend.data._M_elems[3] = leavebound.m_backend.data._M_elems[3];
        result_4.m_backend.data._M_elems[0xc] = leavebound.m_backend.data._M_elems[0xc];
        result_4.m_backend.data._M_elems[0xd] = leavebound.m_backend.data._M_elems[0xd];
        result_4.m_backend.data._M_elems._56_5_ = leavebound.m_backend.data._M_elems._56_5_;
        result_4.m_backend.data._M_elems[0xf]._1_3_ = leavebound.m_backend.data._M_elems[0xf]._1_3_;
        result_4.m_backend.data._M_elems[8] = leavebound.m_backend.data._M_elems[8];
        result_4.m_backend.data._M_elems[9] = leavebound.m_backend.data._M_elems[9];
        result_4.m_backend.data._M_elems[10] = leavebound.m_backend.data._M_elems[10];
        result_4.m_backend.data._M_elems[0xb] = leavebound.m_backend.data._M_elems[0xb];
        result_4.m_backend.data._M_elems[4] = leavebound.m_backend.data._M_elems[4];
        result_4.m_backend.data._M_elems[5] = leavebound.m_backend.data._M_elems[5];
        result_4.m_backend.data._M_elems[6] = leavebound.m_backend.data._M_elems[6];
        result_4.m_backend.data._M_elems[7] = leavebound.m_backend.data._M_elems[7];
        result_4.m_backend.exp = leavebound.m_backend.exp;
        result_4.m_backend.neg = leavebound.m_backend.neg;
        result_4.m_backend.fpclass = leavebound.m_backend.fpclass;
        result_4.m_backend.prec_elem = leavebound.m_backend.prec_elem;
        result_4.m_backend.data._M_elems[0] = leavebound.m_backend.data._M_elems[0];
        if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
            result_4.m_backend.data._M_elems[0] != 0) {
          result_4.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
        }
        result_4.m_backend.data._M_elems._0_8_ = uVar4;
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)this->theFrhs,&result_4,
                   (this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).matrix.data[uVar10]);
      }
      else {
        epsilon(&local_5d8,this);
        result_7.m_backend.data._M_elems[0] = local_5d8.m_backend.data._M_elems[0];
        result_7.m_backend.data._M_elems[1] = local_5d8.m_backend.data._M_elems[1];
        uVar4 = result_7.m_backend.data._M_elems._0_8_;
        result_7.m_backend.data._M_elems[2] = local_5d8.m_backend.data._M_elems[2];
        result_7.m_backend.data._M_elems[3] = local_5d8.m_backend.data._M_elems[3];
        result_7.m_backend.data._M_elems[0xc] = local_5d8.m_backend.data._M_elems[0xc];
        result_7.m_backend.data._M_elems[0xd] = local_5d8.m_backend.data._M_elems[0xd];
        result_7.m_backend.data._M_elems[0xe] = local_5d8.m_backend.data._M_elems[0xe];
        result_7.m_backend.data._M_elems[0xf] = local_5d8.m_backend.data._M_elems[0xf];
        result_7.m_backend.data._M_elems[8] = local_5d8.m_backend.data._M_elems[8];
        result_7.m_backend.data._M_elems[9] = local_5d8.m_backend.data._M_elems[9];
        result_7.m_backend.data._M_elems[10] = local_5d8.m_backend.data._M_elems[10];
        result_7.m_backend.data._M_elems[0xb] = local_5d8.m_backend.data._M_elems[0xb];
        result_7.m_backend.data._M_elems[4] = local_5d8.m_backend.data._M_elems[4];
        result_7.m_backend.data._M_elems[5] = local_5d8.m_backend.data._M_elems[5];
        result_7.m_backend.data._M_elems[6] = local_5d8.m_backend.data._M_elems[6];
        result_7.m_backend.data._M_elems[7] = local_5d8.m_backend.data._M_elems[7];
        result_7.m_backend.exp = local_5d8.m_backend.exp;
        result_7.m_backend.neg = local_5d8.m_backend.neg;
        result_7.m_backend.fpclass = local_5d8.m_backend.fpclass;
        result_7.m_backend.prec_elem = local_5d8.m_backend.prec_elem;
        result_7.m_backend.data._M_elems[0] = local_5d8.m_backend.data._M_elems[0];
        if (local_5d8.m_backend.fpclass != cpp_dec_float_finite ||
            result_7.m_backend.data._M_elems[0] != 0) {
          result_7.m_backend.neg = (bool)(local_5d8.m_backend.neg ^ 1);
        }
        result_7.m_backend.data._M_elems._0_8_ = uVar4;
        tVar6 = boost::multiprecision::operator<(&leavebound,&result_7);
        if (tVar6) goto LAB_002f9562;
      }
      epsilon(&result_4,this);
      tVar6 = boost::multiprecision::operator>(&enterVal,&result_4);
      if (tVar6) {
LAB_002f96c2:
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)this->theFrhs,&enterVal,rhs);
      }
      else {
        epsilon(&local_5d8,this);
        result_7.m_backend.data._M_elems[0] = local_5d8.m_backend.data._M_elems[0];
        result_7.m_backend.data._M_elems[1] = local_5d8.m_backend.data._M_elems[1];
        uVar4 = result_7.m_backend.data._M_elems._0_8_;
        result_7.m_backend.data._M_elems[2] = local_5d8.m_backend.data._M_elems[2];
        result_7.m_backend.data._M_elems[3] = local_5d8.m_backend.data._M_elems[3];
        result_7.m_backend.data._M_elems[0xc] = local_5d8.m_backend.data._M_elems[0xc];
        result_7.m_backend.data._M_elems[0xd] = local_5d8.m_backend.data._M_elems[0xd];
        result_7.m_backend.data._M_elems[0xe] = local_5d8.m_backend.data._M_elems[0xe];
        result_7.m_backend.data._M_elems[0xf] = local_5d8.m_backend.data._M_elems[0xf];
        result_7.m_backend.data._M_elems[8] = local_5d8.m_backend.data._M_elems[8];
        result_7.m_backend.data._M_elems[9] = local_5d8.m_backend.data._M_elems[9];
        result_7.m_backend.data._M_elems[10] = local_5d8.m_backend.data._M_elems[10];
        result_7.m_backend.data._M_elems[0xb] = local_5d8.m_backend.data._M_elems[0xb];
        result_7.m_backend.data._M_elems[4] = local_5d8.m_backend.data._M_elems[4];
        result_7.m_backend.data._M_elems[5] = local_5d8.m_backend.data._M_elems[5];
        result_7.m_backend.data._M_elems[6] = local_5d8.m_backend.data._M_elems[6];
        result_7.m_backend.data._M_elems[7] = local_5d8.m_backend.data._M_elems[7];
        result_7.m_backend.exp = local_5d8.m_backend.exp;
        result_7.m_backend.neg = local_5d8.m_backend.neg;
        result_7.m_backend.fpclass = local_5d8.m_backend.fpclass;
        result_7.m_backend.prec_elem = local_5d8.m_backend.prec_elem;
        result_7.m_backend.data._M_elems[0] = local_5d8.m_backend.data._M_elems[0];
        if (local_5d8.m_backend.fpclass != cpp_dec_float_finite ||
            result_7.m_backend.data._M_elems[0] != 0) {
          result_7.m_backend.neg = (bool)(local_5d8.m_backend.neg ^ 1);
        }
        result_7.m_backend.data._M_elems._0_8_ = uVar4;
        tVar6 = boost::multiprecision::operator<(&enterVal,&result_7);
        if (tVar6) goto LAB_002f96c2;
      }
      local_308[0].m_backend.data._M_elems[0xc] = objChange.sum.m_backend.data._M_elems[0xc];
      local_308[0].m_backend.data._M_elems[0xd] = objChange.sum.m_backend.data._M_elems[0xd];
      local_308[0].m_backend.data._M_elems[0xe] = objChange.sum.m_backend.data._M_elems[0xe];
      local_308[0].m_backend.data._M_elems[0xf] = objChange.sum.m_backend.data._M_elems[0xf];
      local_308[0].m_backend.data._M_elems[8] = objChange.sum.m_backend.data._M_elems[8];
      local_308[0].m_backend.data._M_elems[9] = objChange.sum.m_backend.data._M_elems[9];
      local_308[0].m_backend.data._M_elems[10] = objChange.sum.m_backend.data._M_elems[10];
      local_308[0].m_backend.data._M_elems[0xb] = objChange.sum.m_backend.data._M_elems[0xb];
      local_308[0].m_backend.data._M_elems[4] = objChange.sum.m_backend.data._M_elems[4];
      local_308[0].m_backend.data._M_elems[5] = objChange.sum.m_backend.data._M_elems[5];
      local_308[0].m_backend.data._M_elems[6] = objChange.sum.m_backend.data._M_elems[6];
      local_308[0].m_backend.data._M_elems[7] = objChange.sum.m_backend.data._M_elems[7];
      local_308[0].m_backend.data._M_elems[0] = objChange.sum.m_backend.data._M_elems[0];
      local_308[0].m_backend.data._M_elems[1] = objChange.sum.m_backend.data._M_elems[1];
      local_308[0].m_backend.data._M_elems[2] = objChange.sum.m_backend.data._M_elems[2];
      local_308[0].m_backend.data._M_elems[3] = objChange.sum.m_backend.data._M_elems[3];
      local_308[0].m_backend.exp = objChange.sum.m_backend.exp;
      local_308[0].m_backend.neg = objChange.sum.m_backend.neg;
      local_308[0].m_backend.fpclass = objChange.sum.m_backend.fpclass;
      local_308[0].m_backend.prec_elem = objChange.sum.m_backend.prec_elem;
      updateNonbasicValue(this,local_308);
      pSVar18 = &this->theFvec->thedelta;
      pp_Var13 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxBasisBase;
      uVar20 = (ulong)uVar16;
      goto LAB_002f9831;
    }
    local_6c8.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
    local_6c8.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
    local_6c8.m_backend.data._M_elems[0xe] = result.m_backend.data._M_elems[0xe];
    local_6c8.m_backend.data._M_elems[0xf] = result.m_backend.data._M_elems[0xf];
    local_6c8.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
    local_6c8.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
    local_6c8.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
    local_6c8.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
    local_6c8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_6c8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_6c8.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
    local_6c8.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
    local_6c8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_6c8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_6c8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_6c8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_6c8.m_backend.exp = result.m_backend.exp;
    local_6c8.m_backend.neg = result.m_backend.neg;
    local_6c8.m_backend.fpclass = result.m_backend.fpclass;
    local_6c8.m_backend.prec_elem = result.m_backend.prec_elem;
    result_10.m_backend.data._M_elems[0xf] = enterMax.m_backend.data._M_elems[0xf];
    result_10.m_backend.data._M_elems[0xe] = enterMax.m_backend.data._M_elems[0xe];
    result_10.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    result_10.m_backend.data._M_elems[1] = enterMax.m_backend.data._M_elems[1];
    uVar4 = result_10.m_backend.data._M_elems._0_8_;
    result_10.m_backend.data._M_elems[2] = enterMax.m_backend.data._M_elems[2];
    result_10.m_backend.data._M_elems[3] = enterMax.m_backend.data._M_elems[3];
    result_10.m_backend.data._M_elems[4] = enterMax.m_backend.data._M_elems[4];
    result_10.m_backend.data._M_elems[5] = enterMax.m_backend.data._M_elems[5];
    result_10.m_backend.data._M_elems[6] = enterMax.m_backend.data._M_elems[6];
    result_10.m_backend.data._M_elems[7] = enterMax.m_backend.data._M_elems[7];
    result_10.m_backend.data._M_elems[8] = enterMax.m_backend.data._M_elems[8];
    result_10.m_backend.data._M_elems[9] = enterMax.m_backend.data._M_elems[9];
    result_10.m_backend.data._M_elems[10] = enterMax.m_backend.data._M_elems[10];
    result_10.m_backend.data._M_elems[0xb] = enterMax.m_backend.data._M_elems[0xb];
    result_10.m_backend.data._M_elems[0xc] = enterMax.m_backend.data._M_elems[0xc];
    result_10.m_backend.data._M_elems[0xd] = enterMax.m_backend.data._M_elems[0xd];
    result_10.m_backend.exp = enterMax.m_backend.exp;
    result_10.m_backend.neg = enterMax.m_backend.neg;
    result_10.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_10.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    result_10.m_backend.data._M_elems[0] = enterMax.m_backend.data._M_elems[0];
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
        result_10.m_backend.data._M_elems[0] != 0) {
      result_10.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    result_10.m_backend.data._M_elems._0_8_ = uVar4;
    RVar3 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_6c8,&result_10,RVar3);
    if (!bVar8) {
      if (cVar19 == '\0') {
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&leavebound.m_backend,*pdVar11,(type *)0x0);
        tVar6 = boost::multiprecision::operator<
                          (&result,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&leavebound.m_backend);
        if (tVar6) {
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,-*pdVar11,(type *)0x0);
          tVar6 = boost::multiprecision::operator>
                            (&result,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&result_4.m_backend);
          if (tVar6) {
            (**(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase)
                      (&this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,0xffffffffffffffff,pDVar14,rhs,0);
            pUVar15 = this->theFvec;
            *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 0xc) =
                 result.m_backend.data._M_elems._48_8_;
            *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 0xe) =
                 result.m_backend.data._M_elems._56_8_;
            *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 8) =
                 result.m_backend.data._M_elems._32_8_;
            *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 10) =
                 result.m_backend.data._M_elems._40_8_;
            *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 4) =
                 result.m_backend.data._M_elems._16_8_;
            *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 6) =
                 result.m_backend.data._M_elems._24_8_;
            *(undefined8 *)(pUVar15->theval).m_backend.data._M_elems =
                 result.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((pUVar15->theval).m_backend.data._M_elems + 2) =
                 result.m_backend.data._M_elems._8_8_;
            (pUVar15->theval).m_backend.exp = result.m_backend.exp;
            (pUVar15->theval).m_backend.neg = result.m_backend.neg;
            (pUVar15->theval).m_backend.fpclass = result.m_backend.fpclass;
            (pUVar15->theval).m_backend.prec_elem = result.m_backend.prec_elem;
            UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::update(this->theFvec);
            local_3f8 = result.m_backend.data._M_elems[0];
            uStack_3f4 = result.m_backend.data._M_elems[1];
            uStack_3f0 = result.m_backend.data._M_elems[2];
            uStack_3ec = result.m_backend.data._M_elems[3];
            local_3e8 = result.m_backend.data._M_elems[4];
            uStack_3e4 = result.m_backend.data._M_elems[5];
            uStack_3e0 = result.m_backend.data._M_elems[6];
            uStack_3dc = result.m_backend.data._M_elems[7];
            local_3d8 = result.m_backend.data._M_elems[8];
            uStack_3d4 = result.m_backend.data._M_elems[9];
            uStack_3d0 = result.m_backend.data._M_elems[10];
            uStack_3cc = result.m_backend.data._M_elems[0xb];
            local_3c8 = result.m_backend.data._M_elems[0xc];
            uStack_3c4 = result.m_backend.data._M_elems[0xd];
            uStack_3c0 = result.m_backend.data._M_elems[0xe];
            uStack_3bc = result.m_backend.data._M_elems[0xf];
            local_3b8 = result.m_backend.exp;
            local_3b4 = result.m_backend.neg;
            local_3b0 = result.m_backend.fpclass;
            iStack_3ac = result.m_backend.prec_elem;
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x83])
                      (this,*pDVar14,(ulong)(uint)enterStat,&local_3f8,rhs,&objChange);
            local_448.m_backend.data._M_elems[0xc] = objChange.sum.m_backend.data._M_elems[0xc];
            local_448.m_backend.data._M_elems[0xd] = objChange.sum.m_backend.data._M_elems[0xd];
            local_448.m_backend.data._M_elems[0xe] = objChange.sum.m_backend.data._M_elems[0xe];
            local_448.m_backend.data._M_elems[0xf] = objChange.sum.m_backend.data._M_elems[0xf];
            local_448.m_backend.data._M_elems[8] = objChange.sum.m_backend.data._M_elems[8];
            local_448.m_backend.data._M_elems[9] = objChange.sum.m_backend.data._M_elems[9];
            local_448.m_backend.data._M_elems[10] = objChange.sum.m_backend.data._M_elems[10];
            local_448.m_backend.data._M_elems[0xb] = objChange.sum.m_backend.data._M_elems[0xb];
            local_448.m_backend.data._M_elems[4] = objChange.sum.m_backend.data._M_elems[4];
            local_448.m_backend.data._M_elems[5] = objChange.sum.m_backend.data._M_elems[5];
            local_448.m_backend.data._M_elems[6] = objChange.sum.m_backend.data._M_elems[6];
            local_448.m_backend.data._M_elems[7] = objChange.sum.m_backend.data._M_elems[7];
            local_448.m_backend.data._M_elems[0] = objChange.sum.m_backend.data._M_elems[0];
            local_448.m_backend.data._M_elems[1] = objChange.sum.m_backend.data._M_elems[1];
            local_448.m_backend.data._M_elems[2] = objChange.sum.m_backend.data._M_elems[2];
            local_448.m_backend.data._M_elems[3] = objChange.sum.m_backend.data._M_elems[3];
            local_448.m_backend.exp = objChange.sum.m_backend.exp;
            local_448.m_backend.neg = objChange.sum.m_backend.neg;
            local_448.m_backend.fpclass = objChange.sum.m_backend.fpclass;
            local_448.m_backend.prec_elem = objChange.sum.m_backend.prec_elem;
            updateNonbasicValue(this,&local_448);
            return bVar21;
          }
        }
      }
      local_468 = enterTest.m_backend.data._M_elems[0xc];
      uStack_464 = enterTest.m_backend.data._M_elems[0xd];
      uStack_460 = enterTest.m_backend.data._M_elems[0xe];
      uStack_45c = enterTest.m_backend.data._M_elems[0xf];
      local_478 = enterTest.m_backend.data._M_elems[8];
      uStack_474 = enterTest.m_backend.data._M_elems[9];
      uStack_470 = enterTest.m_backend.data._M_elems[10];
      uStack_46c = enterTest.m_backend.data._M_elems[0xb];
      local_488 = enterTest.m_backend.data._M_elems[4];
      uStack_484 = enterTest.m_backend.data._M_elems[5];
      uStack_480 = enterTest.m_backend.data._M_elems[6];
      uStack_47c = enterTest.m_backend.data._M_elems[7];
      local_498 = enterTest.m_backend.data._M_elems[0];
      uStack_494 = enterTest.m_backend.data._M_elems[1];
      uStack_490 = enterTest.m_backend.data._M_elems[2];
      uStack_48c = enterTest.m_backend.data._M_elems[3];
      local_458 = enterTest.m_backend.exp;
      local_454 = enterTest.m_backend.neg;
      local_450 = enterTest.m_backend.fpclass;
      iStack_44c = enterTest.m_backend.prec_elem;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(this,*pDVar14,&local_498,(ulong)(uint)enterStat);
      (**(this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)
                (&this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffffffffffff,&none,0,0);
      if (cVar19 != '\0') {
        return bVar21;
      }
      if (1 < (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).updateCount) {
        pSVar12 = this->spxout;
        if ((pSVar12 != (SPxOut *)0x0) && (4 < (int)pSVar12->m_verbosity)) {
          leavebound.m_backend.data._M_elems[0] = pSVar12->m_verbosity;
          result_4.m_backend.data._M_elems[0] = 5;
          (*pSVar12->_vptr_SPxOut[2])();
          pSVar12 = soplex::operator<<(this->spxout,"IENTER01 factorization triggered in ");
          pSVar12 = soplex::operator<<(pSVar12,"enter() for feasibility test");
          std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
        }
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x75])(this);
        return bVar21;
      }
      uStack_4b0 = CONCAT44(enterTest.m_backend.data._M_elems[0xf],
                            enterTest.m_backend.data._M_elems[0xe]);
      local_4e8 = (multiprecision  [8])enterTest.m_backend.data._M_elems._0_8_;
      auStack_4e0[0] = enterTest.m_backend.data._M_elems[2];
      auStack_4e0[1] = enterTest.m_backend.data._M_elems[3];
      local_4d8[0] = enterTest.m_backend.data._M_elems[4];
      local_4d8[1] = enterTest.m_backend.data._M_elems[5];
      auStack_4d0[0] = enterTest.m_backend.data._M_elems[6];
      auStack_4d0[1] = enterTest.m_backend.data._M_elems[7];
      local_4c8[0] = enterTest.m_backend.data._M_elems[8];
      local_4c8[1] = enterTest.m_backend.data._M_elems[9];
      auStack_4c0[0] = enterTest.m_backend.data._M_elems[10];
      auStack_4c0[1] = enterTest.m_backend.data._M_elems[0xb];
      local_4b8[0] = enterTest.m_backend.data._M_elems[0xc];
      local_4b8[1] = enterTest.m_backend.data._M_elems[0xd];
      local_4a8 = enterTest.m_backend.exp;
      local_4a4 = enterTest.m_backend.neg;
      local_4a0 = enterTest.m_backend.fpclass;
      iStack_49c = enterTest.m_backend.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&leavebound,local_4e8,arg_00);
      entertol(&result_4,this);
      tVar6 = boost::multiprecision::operator<(&leavebound,&result_4);
      pSVar12 = this->spxout;
      if (tVar6) {
        if ((pSVar12 != (SPxOut *)0x0) && (4 < (int)pSVar12->m_verbosity)) {
          leavebound.m_backend.data._M_elems[0] = pSVar12->m_verbosity;
          result_4.m_backend.data._M_elems[0] = 5;
          (*pSVar12->_vptr_SPxOut[2])();
          pSVar12 = soplex::operator<<(this->spxout,
                                       "IENTER11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
        }
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coSolve(&this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&this->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,this->theCoPrhs);
        computePvec(this);
        computeCoTest(this);
        computeTest(this);
        return bVar21;
      }
      if ((pSVar12 != (SPxOut *)0x0) && (4 < (int)pSVar12->m_verbosity)) {
        leavebound.m_backend.data._M_elems[0] = pSVar12->m_verbosity;
        result_4.m_backend.data._M_elems[0] = 5;
        (*pSVar12->_vptr_SPxOut[2])();
        pSVar12 = soplex::operator<<(this->spxout,"IENTER02 unboundedness/infeasibility found in ");
        pSVar12 = soplex::operator<<(pSVar12,"enter()");
        std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
      }
      if (this->theRep == ROW) {
        local_538.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
        local_538.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
        local_538.m_backend.data._M_elems[0xe] = result.m_backend.data._M_elems[0xe];
        local_538.m_backend.data._M_elems[0xf] = result.m_backend.data._M_elems[0xf];
        local_538.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
        local_538.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
        local_538.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
        local_538.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
        local_538.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        local_538.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        local_538.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
        local_538.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
        local_538.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        local_538.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        local_538.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        local_538.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        local_538.m_backend.exp = result.m_backend.exp;
        local_538.m_backend.neg = result.m_backend.neg;
        local_538.m_backend.fpclass = result.m_backend.fpclass;
        local_538.m_backend.prec_elem = result.m_backend.prec_elem;
        computeDualfarkas4Row(this,&local_538,(SPxId)*local_a90);
        stat = INFEASIBLE;
      }
      else {
        local_588.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
        local_588.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
        local_588.m_backend.data._M_elems[0xe] = result.m_backend.data._M_elems[0xe];
        local_588.m_backend.data._M_elems[0xf] = result.m_backend.data._M_elems[0xf];
        local_588.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
        local_588.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
        local_588.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
        local_588.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
        local_588.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        local_588.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        local_588.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
        local_588.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
        local_588.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        local_588.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        local_588.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        local_588.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        local_588.m_backend.exp = result.m_backend.exp;
        local_588.m_backend.neg = result.m_backend.neg;
        local_588.m_backend.fpclass = result.m_backend.fpclass;
        local_588.m_backend.prec_elem = result.m_backend.prec_elem;
        computePrimalray4Col(this,&local_588,(SPxId)*local_a90);
        stat = UNBOUNDED;
      }
      setBasisStatus(this,stat);
      return bVar21;
    }
    DVar17 = *pDVar14;
    if (bVar7 == false) {
      (this->instableEnterId).super_DataKey = DVar17;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 0xc) =
           enterTest.m_backend.data._M_elems._48_8_;
      *(ulong *)((this->instableEnterVal).m_backend.data._M_elems + 0xe) =
           CONCAT44(enterTest.m_backend.data._M_elems[0xf],enterTest.m_backend.data._M_elems[0xe]);
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 8) =
           enterTest.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 10) =
           enterTest.m_backend.data._M_elems._40_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 4) =
           enterTest.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 6) =
           enterTest.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(this->instableEnterVal).m_backend.data._M_elems =
           enterTest.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((this->instableEnterVal).m_backend.data._M_elems + 2) =
           enterTest.m_backend.data._M_elems._8_8_;
      (this->instableEnterVal).m_backend.exp = enterTest.m_backend.exp;
      (this->instableEnterVal).m_backend.neg = enterTest.m_backend.neg;
      (this->instableEnterVal).m_backend.fpclass = enterTest.m_backend.fpclass;
      (this->instableEnterVal).m_backend.prec_elem = enterTest.m_backend.prec_elem;
      DVar17 = *pDVar14;
      leavebound.m_backend.data._M_elems[0] = 0;
      leavebound.m_backend.data._M_elems[1] = 0x40240000;
      t = &local_358;
      local_358.fpclass = cpp_dec_float_finite;
      local_358.prec_elem = 0x10;
      local_358.data._M_elems[0] = 0;
      local_358.data._M_elems[1] = 0;
      local_358.data._M_elems[2] = 0;
      local_358.data._M_elems[3] = 0;
      local_358.data._M_elems[4] = 0;
      local_358.data._M_elems[5] = 0;
      local_358.data._M_elems[6] = 0;
      local_358.data._M_elems[7] = 0;
      local_358.data._M_elems[8] = 0;
      local_358.data._M_elems[9] = 0;
      local_358.data._M_elems[10] = 0;
      local_358.data._M_elems[0xb] = 0;
      local_358.data._M_elems[0xc] = 0;
      local_358.data._M_elems[0xd] = 0;
      local_358.data._M_elems._56_5_ = 0;
      local_358.data._M_elems[0xf]._1_3_ = 0;
      local_358.exp = 0;
      local_358.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                (t,&enterTest.m_backend,(double *)&leavebound);
      pp_Var13 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray;
    }
    else {
      local_3a8.data._M_elems[0xf] = enterTest.m_backend.data._M_elems[0xf];
      local_3a8.data._M_elems[0xe] = enterTest.m_backend.data._M_elems[0xe];
      t = &local_3a8;
      local_3a8.data._M_elems[0xc] = enterTest.m_backend.data._M_elems[0xc];
      local_3a8.data._M_elems[0xd] = enterTest.m_backend.data._M_elems[0xd];
      local_3a8.data._M_elems[8] = enterTest.m_backend.data._M_elems[8];
      local_3a8.data._M_elems[9] = enterTest.m_backend.data._M_elems[9];
      local_3a8.data._M_elems[10] = enterTest.m_backend.data._M_elems[10];
      local_3a8.data._M_elems[0xb] = enterTest.m_backend.data._M_elems[0xb];
      local_3a8.data._M_elems[4] = enterTest.m_backend.data._M_elems[4];
      local_3a8.data._M_elems[5] = enterTest.m_backend.data._M_elems[5];
      local_3a8.data._M_elems[6] = enterTest.m_backend.data._M_elems[6];
      local_3a8.data._M_elems[7] = enterTest.m_backend.data._M_elems[7];
      local_3a8.data._M_elems[0] = enterTest.m_backend.data._M_elems[0];
      local_3a8.data._M_elems[1] = enterTest.m_backend.data._M_elems[1];
      local_3a8.data._M_elems[2] = enterTest.m_backend.data._M_elems[2];
      local_3a8.data._M_elems[3] = enterTest.m_backend.data._M_elems[3];
      local_3a8.exp = enterTest.m_backend.exp;
      local_3a8.neg = enterTest.m_backend.neg;
      local_3a8.fpclass = enterTest.m_backend.fpclass;
      local_3a8.prec_elem = enterTest.m_backend.prec_elem;
      pp_Var13 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._vptr_ClassArray;
    }
    (*pp_Var13[0x84])(this,DVar17,t,(ulong)(uint)enterStat);
    pp_Var13 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
  }
  uVar20 = 0xffffffffffffffff;
  pDVar14 = &none.super_DataKey;
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0;
  pSVar18 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
LAB_002f9831:
  (**pp_Var13)(&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,uVar20,pDVar14,rhs,pSVar18);
  return bVar21;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}